

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O0

void cpp_wrapper_range(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int min_key,int max_key,
                      int *expected_records,int expected_num_records,ion_boolean_t records_exist)

{
  int32_t iVar1;
  planck_unit_result_t pVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Cursor<int,_int> *this;
  int local_48;
  bool local_41;
  int i;
  int iStack_3c;
  ion_cursor_status_t status;
  int curr_pos;
  int records_found;
  Cursor<int,_int> *cursor;
  int expected_num_records_local;
  int *expected_records_local;
  int max_key_local;
  int min_key_local;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(min_key < max_key),0xa2,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  this = Dictionary<int,_int>::range(dict,min_key,max_key);
  if (records_exist == '\0') {
    bVar3 = Cursor<int,_int>::hasNext(this);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((bVar3 ^ 0xffU) & 1),0xa7,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    bVar3 = Cursor<int,_int>::next(this);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((bVar3 ^ 0xffU) & 1),0xa8,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    if (this != (Cursor<int,_int> *)0x0) {
      Cursor<int,_int>::~Cursor(this);
      operator_delete(this);
    }
  }
  else {
    bVar3 = Cursor<int,_int>::hasNext(this);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)bVar3,0xaf,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    iStack_3c = 0;
    i = 0;
    local_41 = Cursor<int,_int>::next(this);
    while (local_41 != false) {
      for (local_48 = 0; local_48 < expected_num_records; local_48 = local_48 + 1) {
        iVar5 = expected_records[local_48];
        iVar4 = Cursor<int,_int>::getKey(this);
        if (iVar5 == iVar4) {
          i = local_48;
          break;
        }
      }
      iVar1 = expected_records[i];
      iVar5 = Cursor<int,_int>::getKey(this);
      pVar2 = planck_unit_assert_int_are_equal
                        (tc,iVar1,iVar5,0xbe,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                        );
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      iVar1 = expected_records[i];
      iVar5 = Cursor<int,_int>::getValue(this);
      pVar2 = planck_unit_assert_int_are_equal
                        (tc,iVar1,iVar5,0xbf,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                        );
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      expected_records[i] = 999;
      local_41 = Cursor<int,_int>::next(this);
      iStack_3c = iStack_3c + 1;
    }
    bVar3 = Cursor<int,_int>::hasNext(this);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((bVar3 ^ 0xffU) & 1),199,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,expected_num_records,iStack_3c,0xca,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                      );
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    if (this != (Cursor<int,_int> *)0x0) {
      Cursor<int,_int>::~Cursor(this);
      operator_delete(this);
    }
  }
  return;
}

Assistant:

void
cpp_wrapper_range(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int min_key,
	int max_key,
	int expected_records[],
	int expected_num_records,
	ion_boolean_t records_exist
) {
	PLANCK_UNIT_ASSERT_TRUE(tc, min_key < max_key);

	Cursor<int, int> *cursor = dict->range(min_key, max_key);

	if (!records_exist) {
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->next());

		delete cursor;

		return;
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, cursor->hasNext());

	int records_found			= 0;
	int curr_pos				= 0;

	ion_cursor_status_t status	= cursor->next();

	while (status) {
		for (int i = 0; i < expected_num_records; i++) {
			if (expected_records[i] == cursor->getKey()) {
				curr_pos = i;
				break;
			}
		}

		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_records[curr_pos], cursor->getKey());
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_records[curr_pos], cursor->getValue());

		expected_records[curr_pos]	= NULL_VALUE;
		status						= cursor->next();
		min_key++;
		records_found++;
	}

	PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());

	/* Check that same number of records are found as were inserted with desired key. */
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_num_records, records_found);

	delete cursor;
}